

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O0

void __thiscall kj::GzipOutputStream::pump(GzipOutputStream *this,int flush)

{
  TypeByIndex<0UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> TVar1;
  TypeByIndex<0UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> *pTVar2;
  TypeByIndex<1UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> *pTVar3;
  size_t sVar4;
  undefined1 local_40 [8];
  TypeByIndex<1UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> chunk;
  Tuple<bool,_kj::ArrayPtr<const_byte>_> result;
  bool ok;
  int flush_local;
  GzipOutputStream *this_local;
  
  do {
    kj::_::GzipOutputContext::pumpOnce
              ((Tuple<bool,_kj::ArrayPtr<const_byte>_> *)&chunk.size_,&this->ctx,flush);
    pTVar2 = get<0ul,kj::_::Tuple<bool,kj::ArrayPtr<unsigned_char_const>>&>
                       ((Tuple<bool,_kj::ArrayPtr<const_unsigned_char>_> *)&chunk.size_);
    TVar1 = *pTVar2;
    pTVar3 = get<1ul,kj::_::Tuple<bool,kj::ArrayPtr<unsigned_char_const>>&>
                       ((Tuple<bool,_kj::ArrayPtr<const_unsigned_char>_> *)&chunk.size_);
    local_40 = (undefined1  [8])pTVar3->ptr;
    chunk.ptr = (uchar *)pTVar3->size_;
    sVar4 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_40);
    if (sVar4 != 0) {
      (*this->inner->_vptr_OutputStream[2])(this->inner,local_40,chunk.ptr);
    }
  } while ((TVar1 & 1U) != 0);
  return;
}

Assistant:

void GzipOutputStream::pump(int flush) {
  bool ok;
  do {
    auto result = ctx.pumpOnce(flush);
    ok = get<0>(result);
    auto chunk = get<1>(result);
    if (chunk.size() > 0) {
      inner.write(chunk);
    }
  } while (ok);
}